

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chip8.cpp
# Opt level: O1

void __thiscall Chip8::OP_8XY6(Chip8 *this)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SHR V",5);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{, V",4);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"}                 ; Set Vx = Vx SHR 1",0x25);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void Chip8::OP_8XY6() {
    std::cout << "SHR V"<<((opcode & 0x0F00u) >> 8u) << "{, V"<<((opcode & 0x00F0u) >> 4u)<< "}                 ; Set Vx = Vx SHR 1" << std::endl;
}